

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O3

void __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::KDTree(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
         *this,vector<int_*,_std::allocator<int_*>_> *values)

{
  int iVar1;
  pointer ppiVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  Node *pNVar6;
  int d;
  long lVar7;
  
  piVar4 = (int *)operator_new__(0x14);
  this->boundingBoxMin = piVar4;
  piVar5 = (int *)operator_new__(0x14);
  this->boundingBoxMax = piVar5;
  ppiVar2 = (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppiVar2 ==
      (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    pNVar6 = (Node *)0x0;
  }
  else {
    piVar3 = *ppiVar2;
    lVar7 = 0;
    do {
      iVar1 = piVar3[lVar7];
      piVar4[lVar7] = iVar1;
      piVar5[lVar7] = iVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    pNVar6 = buildKDTree(this,values,0);
  }
  this->root = pNVar6;
  return;
}

Assistant:

KDTree(std::vector<T*> values) {
			if (values.empty()) {
				root = nullptr;
			}
			else {
				for (int d = 0; d < dim; d++) {
					SET()(boundingBoxMin, values[0], d);
					SET()(boundingBoxMax, values[0], d);
				}
				root = buildKDTree(values);
			}
		}